

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall
pbrt::StatRegisterer::StatRegisterer(StatRegisterer *this,AccumFunc func,PixelAccumFunc pfunc)

{
  iterator __position;
  iterator __position_00;
  vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>> *pvVar1;
  vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
  *pvVar2;
  int iVar3;
  _func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr *local_18;
  _func_void_StatsAccumulator_ptr *local_10;
  
  local_18 = (_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr *)pfunc;
  local_10 = func;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&StatRegisterer::mutex);
  if (iVar3 == 0) {
    if (statFuncs ==
        (vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>> *
        )0x0) {
      statFuncs = (vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>>
                   *)operator_new(0x18);
      *(undefined8 *)statFuncs = 0;
      *(undefined8 *)(statFuncs + 8) = 0;
      *(undefined8 *)(statFuncs + 0x10) = 0;
    }
    pvVar1 = statFuncs;
    if (local_10 != (_func_void_StatsAccumulator_ptr *)0x0) {
      __position._M_current = *(_func_void_StatsAccumulator_ptr ***)(statFuncs + 8);
      if (__position._M_current == *(_func_void_StatsAccumulator_ptr ***)(statFuncs + 0x10)) {
        std::
        vector<void(*)(pbrt::StatsAccumulator&),std::allocator<void(*)(pbrt::StatsAccumulator&)>>::
        _M_realloc_insert<void(*const&)(pbrt::StatsAccumulator&)>(statFuncs,__position,&local_10);
      }
      else {
        *__position._M_current = local_10;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
      }
    }
    if (pixelStatFuncs ==
        (vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
         *)0x0) {
      pixelStatFuncs =
           (vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
            *)operator_new(0x18);
      *(undefined8 *)pixelStatFuncs = 0;
      *(undefined8 *)(pixelStatFuncs + 8) = 0;
      *(undefined8 *)(pixelStatFuncs + 0x10) = 0;
    }
    pvVar2 = pixelStatFuncs;
    if (local_18 != (_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr *)0x0) {
      __position_00._M_current =
           *(_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr ***)(pixelStatFuncs + 8);
      if (__position_00._M_current ==
          *(_func_void_Point2<int>_ptr_int_PixelStatsAccumulator_ptr ***)(pixelStatFuncs + 0x10)) {
        std::
        vector<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&),std::allocator<void(*)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>>
        ::_M_realloc_insert<void(*const&)(pbrt::Point2<int>const&,int,pbrt::PixelStatsAccumulator&)>
                  (pixelStatFuncs,__position_00,&local_18);
      }
      else {
        *__position_00._M_current = local_18;
        *(long *)(pvVar2 + 8) = *(long *)(pvVar2 + 8) + 8;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StatRegisterer::mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

StatRegisterer::StatRegisterer(AccumFunc func, PixelAccumFunc pfunc) {
    static std::mutex mutex;
    std::lock_guard<std::mutex> lock(mutex);

    if (statFuncs == nullptr)
        statFuncs = new std::vector<AccumFunc>;
    if (func)
        statFuncs->push_back(func);

    if (pixelStatFuncs == nullptr)
        pixelStatFuncs = new std::vector<PixelAccumFunc>;
    if (pfunc)
        pixelStatFuncs->push_back(pfunc);
}